

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O3

bool __thiscall lzham::vector<unsigned_char>::append(vector<unsigned_char> *this,uchar *p,uint n)

{
  bool bVar1;
  uint uVar2;
  uint min_new_capacity;
  ulong uVar3;
  
  if (n != 0) {
    uVar2 = this->m_size;
    uVar3 = (ulong)uVar2;
    min_new_capacity = uVar2 + n;
    if (!CARRY4(uVar2,n)) {
      if (this->m_capacity < min_new_capacity) {
        bVar1 = elemental_vector::increase_capacity
                          ((elemental_vector *)this,min_new_capacity,true,1,(object_mover)0x0,true);
        if (!bVar1) {
          return false;
        }
        uVar2 = this->m_size;
      }
      memset(this->m_p + uVar2,0,(ulong)(min_new_capacity - uVar2));
    }
    this->m_size = min_new_capacity;
    memcpy(this->m_p + uVar3,p,(ulong)n);
  }
  return true;
}

Assistant:

bool append(const T* p, uint n)
      {
         if (n)
            return insert(m_size, p, n);
         return true;
      }